

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

void __thiscall TRM::Edge::set_bottom(Edge *this,Vertex *v)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Vertex *pVVar3;
  
  pVVar1 = this->bottom;
  if (this->above_prev == (Edge *)0x0) {
    pEVar2 = this->above_next;
    *(Edge **)(pVVar1 + 0x18) = pEVar2;
  }
  else {
    pEVar2 = this->above_next;
    this->above_prev->above_next = pEVar2;
  }
  pVVar3 = (Vertex *)&pEVar2->above_prev;
  if (pEVar2 == (Edge *)0x0) {
    pVVar3 = pVVar1 + 0x20;
  }
  *(Edge **)pVVar3 = this->above_prev;
  this->above_prev = (Edge *)0x0;
  this->above_next = (Edge *)0x0;
  this->bottom = v;
  recompute(this);
  Vertex::insert_above(this->bottom,this);
  return;
}

Assistant:

void Edge::set_bottom(Vertex* v) {
  // remove this edge from bottom's above list
  LinkedList<Edge>::Remove<&Edge::above_prev, &Edge::above_next>(
      this, &bottom->edge_above.head, &bottom->edge_above.tail);
  // update bottom vertex
  bottom = v;
  // recompute line equation
  recompute();
  // insert self to new bottom's above list
  bottom->insert_above(this);
}